

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  cmake *this_00;
  char *pcVar1;
  undefined1 local_68 [8];
  string pfile;
  allocator local_31;
  undefined1 local_30 [8];
  string home;
  cmGlobalGenerator *this_local;
  
  home.field_2._8_8_ = this;
  this_00 = GetCMakeInstance(this);
  pcVar1 = cmake::GetHomeOutputDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)local_68,(string *)local_30);
  GetCMakeInstance(this);
  pcVar1 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)local_68,pcVar1);
  std::__cxx11::string::operator+=((string *)local_68,"/CMakeRuleHashes.txt");
  CheckRuleHashes(this,(string *)local_68,(string *)local_30);
  WriteRuleHashes(this,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = home;
  pfile += this->GetCMakeInstance()->GetCMakeFilesDirectory();
  pfile += "/CMakeRuleHashes.txt";
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
#endif
}